

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O3

void __thiscall sjtu::TrainManager::release_train(TrainManager *this,int argc,string *argv)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *pBVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  size_t sVar4;
  pair<unsigned_int,_bool> pVar5;
  undefined4 extraout_var_00;
  invalid_command *this_01;
  long lVar6;
  undefined8 extraout_RDX;
  TrainManager *this_02;
  ulong uVar7;
  long lVar8;
  long lVar9;
  char *__s;
  int iVar10;
  pair<long,_bool> pVar11;
  pair<sjtu::TrainManager::stationNameType_*,_long> ret_;
  string trainID;
  value_type local_f0;
  TrainManager *local_e0;
  ulong local_d8;
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  undefined1 *local_90;
  long local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  long local_70;
  long local_68;
  long *local_60;
  long local_58;
  long local_50 [2];
  long local_40;
  char local_38;
  
  local_90 = &local_80;
  local_88 = 0;
  local_80 = 0;
  iVar10 = 0;
  local_e0 = this;
  if (0 < argc) {
    do {
      iVar2 = std::__cxx11::string::compare((char *)argv);
      if (iVar2 != 0) {
        this_01 = (invalid_command *)__cxa_allocate_exception(0x68);
        invalid_command::invalid_command(this_01);
        __cxa_throw(this_01,&invalid_command::typeinfo,invalid_command::~invalid_command);
      }
      std::__cxx11::string::_M_assign((string *)&local_90);
      argv = argv + 2;
      iVar10 = iVar10 + 2;
    } while (iVar10 < argc);
  }
  this_02 = local_e0;
  this_00 = local_e0->TrainBpTree;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_90,local_90 + local_88);
  if (local_58 == 0) {
    local_f0.first = 0;
  }
  else {
    lVar8 = 0;
    lVar6 = 0;
    uVar7 = 0;
    do {
      lVar6 = ((long)*(char *)((long)local_60 + lVar8) + lVar6 * 0x239 + 0x100) % 0x3b800001;
      uVar7 = (long)((long)*(char *)((long)local_60 + lVar8) + uVar7 * 0x301 + 0x100) % 0x3b9aca07;
      lVar8 = lVar8 + 1;
    } while (local_58 != lVar8);
    local_f0.first = lVar6 << 0x20 | uVar7;
  }
  pVar11 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                     (this_00,&local_f0.first);
  local_38 = pVar11.second;
  local_40 = pVar11.first;
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (local_38 == '\0') {
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  else {
    iVar10 = (*(this_02->TrainFile->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base
               [2])(this_02->TrainFile,&local_40);
    lVar6 = CONCAT44(extraout_var,iVar10);
    if (*(char *)(lVar6 + 0xa799) == '\x01') {
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    }
    else {
      if (0 < *(int *)(lVar6 + 0x18)) {
        local_d8 = (ulong)((int)(*(ulong *)(lVar6 + 0xa7a0) / 0xa7a8) - 1);
        local_68 = lVar6 + 0x20;
        lVar8 = 0;
        local_70 = lVar6;
        do {
          pBVar1 = this_02->StationBpTree;
          __s = (char *)(lVar8 * 0x1a8 + local_68);
          local_b0 = local_a0;
          sVar4 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,__s,__s + sVar4);
          if (local_a8 == 0) {
            local_f0.first = 0;
          }
          else {
            lVar9 = 0;
            lVar6 = 0;
            uVar7 = 0;
            do {
              lVar6 = ((long)*(char *)((long)local_b0 + lVar9) + lVar6 * 0x239 + 0x100) % 0x3b800001
              ;
              uVar7 = (long)((long)*(char *)((long)local_b0 + lVar9) + uVar7 * 0x301 + 0x100) %
                      0x3b9aca07;
              lVar9 = lVar9 + 1;
            } while (local_a8 != lVar9);
            local_f0.first = lVar6 << 0x20 | uVar7;
          }
          pVar5 = BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::
                  find(pBVar1,&local_f0.first);
          if (local_b0 != local_a0) {
            operator_delete(local_b0,local_a0[0] + 1);
          }
          if (((ulong)pVar5 >> 0x20 & 1) == 0) {
            pBVar1 = this_02->StationBpTree;
            local_d0 = local_c0;
            sVar4 = strlen(__s);
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,__s,__s + sVar4);
            if (local_c8 == 0) {
              uVar7 = 0;
            }
            else {
              lVar9 = 0;
              lVar6 = 0;
              uVar7 = 0;
              do {
                lVar6 = ((long)*(char *)((long)local_d0 + lVar9) + lVar6 * 0x239 + 0x100) %
                        0x3b800001;
                uVar7 = (long)((long)*(char *)((long)local_d0 + lVar9) + uVar7 * 0x301 + 0x100) %
                        0x3b9aca07;
                lVar9 = lVar9 + 1;
              } while (local_c8 != lVar9);
              uVar7 = lVar6 << 0x20 | uVar7;
            }
            local_f0.second = bitset_newblock(local_e0,(uint)local_d8);
            local_f0.first = uVar7;
            BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::insert
                      (pBVar1,&local_f0);
            if (local_d0 != local_c0) {
              operator_delete(local_d0,local_c0[0] + 1);
            }
            this_02 = local_e0;
            iVar10 = (*(local_e0->StationFile->
                       super_FileManager_Base<sjtu::TrainManager::stationNameType>).
                       _vptr_FileManager_Base[1])();
            local_f0.first = CONCAT44(extraout_var_00,iVar10);
            local_f0._8_8_ = extraout_RDX;
            strcpy((char *)local_f0.first,__s);
            (*(this_02->StationFile->super_FileManager_Base<sjtu::TrainManager::stationNameType>).
              _vptr_FileManager_Base[3])(this_02->StationFile,&local_f0.second);
          }
          else {
            bitset_set(this_02,pVar5.first,(uint)local_d8,1);
          }
          lVar8 = lVar8 + 1;
          lVar6 = local_70;
        } while (lVar8 < *(int *)(local_70 + 0x18));
      }
      *(undefined1 *)(lVar6 + 0xa799) = 1;
      (*(this_02->TrainFile->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base[3])();
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    }
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  return;
}

Assistant:

void release_train(int argc , std::string *argv)
		{
			std::string trainID;
			for (int i = 0;i < argc;i += 2)
				if (argv[i] == "-i") trainID = argv[i + 1];
				else throw invalid_command();
			auto ret = TrainBpTree -> find(hasher(trainID));
			if (ret.second == false) std::cout << -1 << std::endl;
			else
			{
				trainType *train = TrainFile -> read(ret.first);
				if (train -> is_released == true) std::cout << -1 << std::endl;
				else
				{
					for (int i = 0 , train_id = train -> offset / sizeof (DynamicFileManager<trainType>::valueType) - 1;i < train -> stationNum;++ i)
					{
						auto ret = StationBpTree -> find(hasher(train -> stations[i].stationName));
						if (ret.second) bitset_set(ret.first , train_id);
						else
						{
							StationBpTree -> insert(std::make_pair(hasher(train -> stations[i].stationName) , bitset_newblock(train_id)));
							auto ret_ = StationFile -> newspace();
							strcpy(ret_.first -> name , train -> stations[i].stationName);
							StationFile -> save(ret_.second);
						}
					}
					train -> is_released = true , TrainFile -> save(train -> offset);
					std::cout << 0 << std::endl;
				}
			}
		}